

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

char * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::GetInterpolationQualifier
          (ConversionStream *this,ShaderParameterInfo *ParamInfo)

{
  size_t __n;
  byte bVar1;
  int iVar2;
  char *pcVar3;
  HLSLTokenInfo *pHVar4;
  char (*in_RCX) [35];
  string msg;
  string local_38;
  
  bVar1 = ParamInfo->interpolationQualifier - Linear;
  if (bVar1 < 5) {
    pcVar3 = &DAT_006ea59c + *(int *)(&DAT_006ea59c + (ulong)bVar1 * 4);
  }
  else {
    pHVar4 = Parsing::HLSLTokenizer::FindKeyword
                       (&this->m_Converter->m_HLSLTokenizer,&ParamInfo->Type);
    if (pHVar4 == (HLSLTokenInfo *)0x0) {
      pcVar3 = "";
    }
    else {
      __n = (pHVar4->Literal)._M_string_length;
      if ((__n != (ParamInfo->Type)._M_string_length) ||
         ((__n != 0 &&
          (iVar2 = bcmp((pHVar4->Literal)._M_dataplus._M_p,(ParamInfo->Type)._M_dataplus._M_p,__n),
          iVar2 != 0)))) {
        FormatString<char[26],char[35]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Keyword->Literal == ParamInfo.Type",in_RCX);
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"GetInterpolationQualifier",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xb51);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar3 = "";
      if (0xffffffc0 < pHVar4->Type - kw_matrix) {
        pcVar3 = "flat";
      }
      if (0xffffffd5 < pHVar4->Type - kw_min16float) {
        pcVar3 = "flat";
      }
    }
  }
  return pcVar3;
}

Assistant:

const char* HLSL2GLSLConverterImpl::ConversionStream::GetInterpolationQualifier(const ShaderParameterInfo& ParamInfo) const
{
    switch (ParamInfo.interpolationQualifier)
    {
        // clang-format off
        case ShaderParameterInfo::InterpolationQualifier::Linear:          return "smooth";
        case ShaderParameterInfo::InterpolationQualifier::Nointerpolation: return "flat";
        case ShaderParameterInfo::InterpolationQualifier::Noperspective:   return "noperspective";
        case ShaderParameterInfo::InterpolationQualifier::Centroid:        return "centroid";
        case ShaderParameterInfo::InterpolationQualifier::Sample:          return "sample";
        // clang-format on
        default:
            break; // To avoid clang/gcc error
    }

    if (const HLSLTokenInfo* Keyword = m_Converter.m_HLSLTokenizer.FindKeyword(ParamInfo.Type))
    {
        VERIFY_EXPR(Keyword->Literal == ParamInfo.Type);
        auto kw = Keyword->Type;
        if ((kw >= TokenType::kw_int && kw <= TokenType::kw_int4x4) ||
            (kw >= TokenType::kw_uint && kw <= TokenType::kw_uint4x4) ||
            (kw >= TokenType::kw_min16int && kw <= TokenType::kw_min16int4x4) ||
            (kw >= TokenType::kw_min12int && kw <= TokenType::kw_min12int4x4) ||
            (kw >= TokenType::kw_min16uint && kw <= TokenType::kw_min16uint4x4))
            return "flat";
    }

    return "";
}